

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void find_suite::adjacent_find_if(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> input;
  iterator iVar1;
  iterator second_end;
  iterator iVar2;
  iterator iVar3;
  basic_iterator<int> first_end;
  allocator<int> local_14d;
  int local_14c [3];
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_cd;
  int local_cc;
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> expect;
  view_pointer local_98;
  size_type local_90;
  view_pointer local_88;
  size_type local_80;
  basic_iterator<int> where;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  where.current = 0x210000002c;
  input._M_len = 5;
  input._M_array = (iterator)&where.current;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_88 = iVar2.parent;
  local_80 = iVar2.current;
  local_98 = iVar3.parent;
  local_90 = iVar3.current;
  first_end = std::
              adjacent_find<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::greater<int>>
                        (local_88,local_80,local_98,local_90);
  local_cc = 0x21;
  local_c8 = &local_cc;
  local_c0 = 1;
  std::allocator<int>::allocator(&local_cd);
  __l_00._M_len = local_c0;
  __l_00._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b8,__l_00,&local_cd);
  std::allocator<int>::~allocator(&local_cd);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_b8);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_b8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x15d,"void find_suite::adjacent_find_if()",iVar2,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  local_14c[0] = 0x21;
  local_14c[1] = 0x16;
  local_14c[2] = 0xb;
  local_140 = local_14c;
  local_138 = 3;
  std::allocator<int>::allocator(&local_14d);
  __l._M_len = local_138;
  __l._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_130,__l,&local_14d);
  std::allocator<int>::~allocator(&local_14d);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_130);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_130);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x162,"void find_suite::adjacent_find_if()",first_end,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_130);
  return;
}

Assistant:

void adjacent_find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 44, 33, 33, 22, 11 };
    auto where = std::adjacent_find(span.begin(), span.end(), std::greater<int>());
    {
        std::vector<int> expect = { 33 };
        BOOST_TEST_ALL_EQ(span.begin(), where,
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 22, 11 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}